

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O0

void __thiscall
Analyser_externalVariableByName_Test::TestBody(Analyser_externalVariableByName_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  char *pcVar2;
  element_type *peVar3;
  element_type *peVar4;
  AssertHelper local_2d8 [8];
  Message local_2d0 [15];
  allocator<char> local_2c1;
  string local_2c0 [39];
  allocator<char> local_299;
  string local_298 [32];
  shared_ptr<libcellml::AnalyserExternalVariable> local_278;
  undefined1 local_268 [16];
  AssertionResult gtest_ar_3;
  Message local_248 [15];
  allocator<char> local_239;
  string local_238 [39];
  allocator<char> local_211;
  string local_210 [32];
  shared_ptr<libcellml::AnalyserExternalVariable> local_1f0;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_2;
  string local_1c8 [39];
  allocator<char> local_1a1;
  string local_1a0 [32];
  shared_ptr<libcellml::Component> local_180;
  shared_ptr<libcellml::Variable> local_170;
  undefined1 local_160 [8];
  AnalyserExternalVariablePtr externalVariable;
  Message local_148 [15];
  allocator<char> local_139;
  string local_138 [39];
  allocator<char> local_111;
  string local_110 [32];
  shared_ptr<libcellml::AnalyserExternalVariable> local_f0;
  undefined1 local_e0 [16];
  AssertionResult gtest_ar_1;
  AnalyserPtr analyser;
  Message local_b0 [8];
  unsigned_long local_a8 [2];
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  allocator<char> local_71;
  string local_70 [32];
  string local_50 [32];
  undefined1 local_30 [8];
  ModelPtr model;
  ParserPtr parser;
  Analyser_externalVariableByName_Test *this_local;
  
  this_00 = &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"generator/hodgkin_huxley_squid_axon_model_1952/model.cellml",&local_71);
  fileContents(local_50);
  libcellml::Parser::parseModel((string *)local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  local_a8[1] = 0;
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_a8[0] = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_98,"size_t(0)","parser->issueCount()",local_a8 + 1,local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
               ,0x24a,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,local_b0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  libcellml::Analyser::create();
  local_e0._0_8_ = (element_type *)0x0;
  peVar3 = std::__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar_1.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_110,"membrane",&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_138,"V",&local_139);
  libcellml::Analyser::externalVariable((shared_ptr *)&local_f0,(string *)peVar3,(string *)local_30)
  ;
  testing::internal::EqHelper<true>::
  Compare<decltype(nullptr),std::shared_ptr<libcellml::AnalyserExternalVariable>>
            (local_e0 + 8,"nullptr",
             (void **)"analyser->externalVariable(model, \"membrane\", \"V\")",
             (shared_ptr<libcellml::AnalyserExternalVariable> *)local_e0,&local_f0);
  std::shared_ptr<libcellml::AnalyserExternalVariable>::~shared_ptr(&local_f0);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator(&local_139);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator(&local_111);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_e0 + 8));
  if (!bVar1) {
    testing::Message::Message(local_148);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_e0 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &externalVariable.
                super___shared_ptr<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
               ,0x24e,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &externalVariable.
                super___shared_ptr<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,local_148);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &externalVariable.
                super___shared_ptr<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_e0 + 8));
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a0,"membrane",&local_1a1);
  libcellml::ComponentEntity::component((string *)&local_180,SUB81(peVar4,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1c8,"V",(allocator<char> *)((long)&gtest_ar_2.message_.ptr_ + 7));
  libcellml::Component::variable((string *)&local_170);
  libcellml::AnalyserExternalVariable::create((shared_ptr *)local_160);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_170);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_2.message_.ptr_ + 7));
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_180);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  peVar3 = std::__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar_1.message_);
  libcellml::Analyser::addExternalVariable((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar_1.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_210,"membrane",&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_238,"V",&local_239);
  libcellml::Analyser::externalVariable
            ((shared_ptr *)&local_1f0,(string *)peVar3,(string *)local_30);
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::AnalyserExternalVariable>,std::shared_ptr<libcellml::AnalyserExternalVariable>>
            ((EqHelper<false> *)local_1e0,"externalVariable",
             "analyser->externalVariable(model, \"membrane\", \"V\")",
             (shared_ptr<libcellml::AnalyserExternalVariable> *)local_160,&local_1f0);
  std::shared_ptr<libcellml::AnalyserExternalVariable>::~shared_ptr(&local_1f0);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator(&local_239);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator(&local_211);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(local_248);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
               ,0x254,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  local_268._0_8_ = (element_type *)0x0;
  peVar3 = std::__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar_1.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_298,"membrane",&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2c0,"X",&local_2c1);
  libcellml::Analyser::externalVariable
            ((shared_ptr *)&local_278,(string *)peVar3,(string *)local_30);
  testing::internal::EqHelper<true>::
  Compare<decltype(nullptr),std::shared_ptr<libcellml::AnalyserExternalVariable>>
            (local_268 + 8,"nullptr",
             (void **)"analyser->externalVariable(model, \"membrane\", \"X\")",
             (shared_ptr<libcellml::AnalyserExternalVariable> *)local_268,&local_278);
  std::shared_ptr<libcellml::AnalyserExternalVariable>::~shared_ptr(&local_278);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator(&local_299);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_268 + 8));
  if (!bVar1) {
    testing::Message::Message(local_2d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_268 + 8));
    testing::internal::AssertHelper::AssertHelper
              (local_2d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
               ,0x255,pcVar2);
    testing::internal::AssertHelper::operator=(local_2d8,local_2d0);
    testing::internal::AssertHelper::~AssertHelper(local_2d8);
    testing::Message::~Message(local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_268 + 8));
  std::shared_ptr<libcellml::AnalyserExternalVariable>::~shared_ptr
            ((shared_ptr<libcellml::AnalyserExternalVariable> *)local_160);
  std::shared_ptr<libcellml::Analyser>::~shared_ptr
            ((shared_ptr<libcellml::Analyser> *)&gtest_ar_1.message_);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_30);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Analyser, externalVariableByName)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto analyser = libcellml::Analyser::create();

    EXPECT_EQ(nullptr, analyser->externalVariable(model, "membrane", "V"));

    auto externalVariable = libcellml::AnalyserExternalVariable::create(model->component("membrane")->variable("V"));

    analyser->addExternalVariable(externalVariable);

    EXPECT_EQ(externalVariable, analyser->externalVariable(model, "membrane", "V"));
    EXPECT_EQ(nullptr, analyser->externalVariable(model, "membrane", "X"));
}